

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
t_rb_generator::ruby_modules_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,t_rb_generator *this,t_program *p)

{
  bool bVar1;
  ulong uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  allocator<char> local_f9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string local_e8;
  string local_c8;
  char local_a1;
  char *local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  char *local_90;
  iterator delim;
  iterator pos;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string ns;
  t_program *p_local;
  t_rb_generator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *modules;
  
  ns.field_2._8_8_ = p;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"rb",&local_61);
  t_program::get_namespace((string *)local_40,p,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    delim._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_98._M_current = delim._M_current;
      local_a0 = (char *)std::__cxx11::string::end();
      local_a1 = '.';
      local_f8 = std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                           (local_98,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_a0,&local_a1);
      local_f0._M_current = delim._M_current;
      local_90 = local_f8._M_current;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((string *)&local_e8,local_f0,local_f8,&local_f9);
      t_generator::capitalize(&local_c8,(t_generator *)this,&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_f9);
      delim._M_current = local_90;
      local_108._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator==(&delim,&local_108);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&delim);
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ruby_modules(const t_program* p) {
    std::string ns = p->get_namespace("rb");
    std::vector<std::string> modules;
    if (ns.empty()) {
      return modules;
    }

    std::string::iterator pos = ns.begin();
    while (true) {
      std::string::iterator delim = std::find(pos, ns.end(), '.');
      modules.push_back(capitalize(std::string(pos, delim)));
      pos = delim;
      if (pos == ns.end()) {
        break;
      }
      ++pos;
    }

    return modules;
  }